

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

bool __thiscall
httplib::ClientImpl::write_request
          (ClientImpl *this,Stream *strm,Request *req,bool close_connection,Error *error)

{
  size_t l;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined7 in_register_00000009;
  Headers *pHVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  string length;
  Headers headers;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58 [2];
  _Base_ptr local_38;
  _Base_ptr local_30;
  
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &headers._M_t._M_impl.super__Rb_tree_header._M_header;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  headers._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       headers._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)CONCAT71(in_register_00000009,close_connection) != 0) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[11],char_const(&)[6]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,(char (*) [11])"Connection",(char (*) [6])"close");
  }
  pHVar4 = &req->headers;
  bVar1 = detail::has_header(pHVar4,"Host");
  if (!bVar1) {
    iVar2 = (*this->_vptr_ClientImpl[6])(this);
    iVar3 = 0x50;
    if ((char)iVar2 != '\0') {
      iVar3 = 0x1bb;
    }
    __args_1 = &this->host_and_port_;
    if (this->port_ == iVar3) {
      __args_1 = &this->host_;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[5],std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,(char (*) [5])"Host",__args_1);
  }
  bVar1 = detail::has_header(pHVar4,"Accept");
  if (!bVar1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[7],char_const(&)[4]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,(char (*) [7])"Accept",(char (*) [4])"*/*");
  }
  bVar1 = detail::has_header(pHVar4,"User-Agent");
  if (!bVar1) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[11],char_const(&)[16]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,(char (*) [11])"User-Agent",(char (*) [16])"cpp-httplib/0.7");
  }
  if ((req->body)._M_string_length == 0) {
    if ((req->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0) {
      bVar1 = std::operator==(&req->method,"POST");
      if (((bVar1) || (bVar1 = std::operator==(&req->method,"PUT"), bVar1)) ||
         (bVar1 = std::operator==(&req->method,"PATCH"), bVar1)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const(&)[15],char_const(&)[2]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)&headers,(char (*) [15])"Content-Length",(char (*) [2])0x127db3);
      }
      goto LAB_0010eb11;
    }
    if (req->is_chunked_content_provider_ != false) goto LAB_0010eb11;
    std::__cxx11::to_string(&length,req->content_length_);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[15],std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,(char (*) [15])"Content-Length",&length);
  }
  else {
    bVar1 = detail::has_header(pHVar4,"Content-Type");
    if (!bVar1) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const(&)[13],char_const(&)[11]>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&headers,(char (*) [13])"Content-Type",(char (*) [11])"text/plain");
    }
    bVar1 = detail::has_header(pHVar4,"Content-Length");
    if (bVar1) goto LAB_0010eb11;
    std::__cxx11::to_string(&length,(req->body)._M_string_length);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[15],std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,(char (*) [15])"Content-Length",&length);
  }
  std::__cxx11::string::~string((string *)&length);
LAB_0010eb11:
  if ((this->basic_auth_password_)._M_string_length != 0) {
    make_basic_authentication_header
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length,&this->basic_auth_username_,&this->basic_auth_password_,false);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&length);
  }
  if (((this->proxy_basic_auth_username_)._M_string_length != 0) &&
     ((this->proxy_basic_auth_password_)._M_string_length != 0)) {
    make_basic_authentication_header
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length,&this->proxy_basic_auth_username_,&this->proxy_basic_auth_password_,true);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&length);
  }
  if ((this->bearer_token_auth_token_)._M_string_length != 0) {
    make_bearer_token_authentication_header
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length,&this->bearer_token_auth_token_,false);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&length);
  }
  if ((this->proxy_bearer_token_auth_token_)._M_string_length != 0) {
    make_bearer_token_authentication_header
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length,&this->proxy_bearer_token_auth_token_,true);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&headers,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&length);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&length);
  }
  length._M_string_length = (long)&length.field_2 + 8;
  length._M_dataplus._M_p = (pointer)&PTR__BufferStream_00141760;
  length.field_2._M_allocated_capacity = 0;
  length.field_2._M_local_buf[8] = '\0';
  detail::encode_url((string *)local_58,&req->path);
  local_30 = (_Base_ptr)(req->method)._M_dataplus._M_p;
  pHVar4 = (Headers *)&local_38;
  local_38 = (_Base_ptr)local_58[0]._0_8_;
  Stream::write_format<char_const*,char_const*>
            ((Stream *)&length,"%s %s HTTP/1.1\r\n",(char **)&local_30,(char **)pHVar4);
  detail::write_headers<httplib::Request>
            ((detail *)&length,(Stream *)req,(Request *)&headers,pHVar4);
  bVar1 = detail::write_data(strm,(char *)length._M_string_length,
                             length.field_2._M_allocated_capacity);
  if (bVar1) {
    std::__cxx11::string::~string((string *)local_58[0]._M_local_buf);
    detail::BufferStream::~BufferStream((BufferStream *)&length);
    l = (req->body)._M_string_length;
    if (l == 0) {
      bVar1 = write_content_with_provider(this,strm,req,error);
    }
    else {
      bVar1 = detail::write_data(strm,(req->body)._M_dataplus._M_p,l);
    }
  }
  else {
    *error = Write;
    std::__cxx11::string::~string((string *)local_58[0]._M_local_buf);
    detail::BufferStream::~BufferStream((BufferStream *)&length);
    bVar1 = false;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&headers._M_t);
  return bVar1;
}

Assistant:

inline bool ClientImpl::write_request(Stream &strm, const Request &req,
										  bool close_connection, Error &error) {
		// Prepare additional headers
		Headers headers;
		if (close_connection) { headers.emplace("Connection", "close"); }

		if (!req.has_header("Host")) {
			if (is_ssl()) {
				if (port_ == 443) {
					headers.emplace("Host", host_);
				} else {
					headers.emplace("Host", host_and_port_);
				}
			} else {
				if (port_ == 80) {
					headers.emplace("Host", host_);
				} else {
					headers.emplace("Host", host_and_port_);
				}
			}
		}

		if (!req.has_header("Accept")) { headers.emplace("Accept", "*/*"); }

		if (!req.has_header("User-Agent")) {
			headers.emplace("User-Agent", "cpp-httplib/0.7");
		}

		if (req.body.empty()) {
			if (req.content_provider_) {
				if (!req.is_chunked_content_provider_) {
					auto length = std::to_string(req.content_length_);
					headers.emplace("Content-Length", length);
				}
			} else {
				if (req.method == "POST" || req.method == "PUT" ||
					req.method == "PATCH") {
					headers.emplace("Content-Length", "0");
				}
			}
		} else {
			if (!req.has_header("Content-Type")) {
				headers.emplace("Content-Type", "text/plain");
			}

			if (!req.has_header("Content-Length")) {
				auto length = std::to_string(req.body.size());
				headers.emplace("Content-Length", length);
			}
		}

		if (!basic_auth_password_.empty()) {
			headers.insert(make_basic_authentication_header(
					basic_auth_username_, basic_auth_password_, false));
		}

		if (!proxy_basic_auth_username_.empty() &&
			!proxy_basic_auth_password_.empty()) {
			headers.insert(make_basic_authentication_header(
					proxy_basic_auth_username_, proxy_basic_auth_password_, true));
		}

		if (!bearer_token_auth_token_.empty()) {
			headers.insert(make_bearer_token_authentication_header(
					bearer_token_auth_token_, false));
		}

		if (!proxy_bearer_token_auth_token_.empty()) {
			headers.insert(make_bearer_token_authentication_header(
					proxy_bearer_token_auth_token_, true));
		}

		// Request line and headers
		{
			detail::BufferStream bstrm;

			const auto &path = detail::encode_url(req.path);
			bstrm.write_format("%s %s HTTP/1.1\r\n", req.method.c_str(), path.c_str());

			detail::write_headers(bstrm, req, headers);

			// Flush buffer
			auto &data = bstrm.get_buffer();
			if (!detail::write_data(strm, data.data(), data.size())) {
				error = Error::Write;
				return false;
			}
		}

		// Body
		if (req.body.empty()) {
			return write_content_with_provider(strm, req, error);
		} else {
			return detail::write_data(strm, req.body.data(), req.body.size());
		}

		return true;
	}